

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O3

string * i2p::SwapBase64(string *__return_storage_ptr__,string *from)

{
  byte bVar1;
  string *psVar2;
  ulong uVar3;
  byte bVar4;
  long in_FS_OFFSET;
  
  psVar2 = *(string **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (__return_storage_ptr__,from->_M_string_length,'\0');
  if (from->_M_string_length != 0) {
    uVar3 = 0;
    do {
      bVar1 = (from->_M_dataplus)._M_p[uVar3];
      if (bVar1 < 0x2f) {
        if (bVar1 == 0x2b) {
          bVar4 = 0x2d;
        }
        else {
          bVar4 = 0x2b;
          if (bVar1 != 0x2d) {
LAB_0087aa30:
            bVar4 = bVar1;
          }
        }
      }
      else if (bVar1 == 0x2f) {
        bVar4 = 0x7e;
      }
      else {
        if (bVar1 != 0x7e) goto LAB_0087aa30;
        bVar4 = 0x2f;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] = bVar4;
      uVar3 = uVar3 + 1;
    } while (uVar3 < from->_M_string_length);
  }
  if (*(string **)(in_FS_OFFSET + 0x28) != psVar2) {
    __stack_chk_fail();
  }
  return *(string **)(in_FS_OFFSET + 0x28);
}

Assistant:

static std::string SwapBase64(const std::string& from)
{
    std::string to;
    to.resize(from.size());
    for (size_t i = 0; i < from.size(); ++i) {
        switch (from[i]) {
        case '-':
            to[i] = '+';
            break;
        case '~':
            to[i] = '/';
            break;
        case '+':
            to[i] = '-';
            break;
        case '/':
            to[i] = '~';
            break;
        default:
            to[i] = from[i];
            break;
        }
    }
    return to;
}